

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O2

int archive_write_cpio_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  wchar_t wVar2;
  int iVar3;
  archive_string_conv *sc;
  int *piVar4;
  int64_t iVar5;
  char *fmt;
  size_t len;
  char *path;
  
  mVar1 = archive_entry_filetype(entry);
  if (mVar1 == 0) {
    fmt = "Filetype required";
  }
  else {
    sc = get_sconv(a);
    wVar2 = _archive_entry_pathname_l(entry,&path,&len,sc);
    if ((wVar2 != L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    if ((path == (char *)0x0 || len == 0) || (*path == '\0')) {
      fmt = "Pathname required";
    }
    else {
      wVar2 = archive_entry_size_is_set(entry);
      if ((wVar2 != L'\0') && (iVar5 = archive_entry_size(entry), -1 < iVar5)) {
        iVar3 = write_header(a,entry);
        return iVar3;
      }
      fmt = "Size required";
    }
  }
  archive_set_error(&a->archive,-1,fmt);
  return -0x19;
}

Assistant:

static int
archive_write_cpio_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *path;
	size_t len;

	if (archive_entry_filetype(entry) == 0) {
		archive_set_error(&a->archive, -1, "Filetype required");
		return (ARCHIVE_FAILED);
	}

	if (archive_entry_pathname_l(entry, &path, &len, get_sconv(a)) != 0
	    && errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Pathname");
		return (ARCHIVE_FATAL);
	}
	if (len == 0 || path == NULL || path[0] == '\0') {
		archive_set_error(&a->archive, -1, "Pathname required");
		return (ARCHIVE_FAILED);
	}

	if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) < 0) {
		archive_set_error(&a->archive, -1, "Size required");
		return (ARCHIVE_FAILED);
	}
	return write_header(a, entry);
}